

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O1

cubeb_resampler *
cubeb_resampler_create
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  uint32_t uVar1;
  delay_line<float> *pdVar2;
  void *pvVar3;
  cubeb_log_level cVar4;
  int iVar5;
  uint32_t uVar6;
  cubeb_stream_params *pcVar7;
  cubeb_resampler *pcVar8;
  cubeb_log_callback p_Var9;
  passthrough_resampler<float> *this;
  cubeb_resampler_speex_one_way<float> *this_00;
  cubeb_resampler_speex_one_way<float> *this_01;
  delay_line<float> *pdVar10;
  code *pcVar11;
  uint32_t uVar12;
  bool bVar13;
  delay_line<float> *pdStackY_60;
  delay_line<float> *pdStackY_58;
  void *pvStackY_50;
  cubeb_resampler_speex_one_way<float> *pcStackY_48;
  cubeb_stream *pcStackY_40;
  cubeb_data_callback p_StackY_38;
  
  pcVar7 = input_params;
  if (input_params == (cubeb_stream_params *)0x0) {
    pcVar7 = output_params;
  }
  if (pcVar7->format != CUBEB_SAMPLE_FLOAT32LE) {
    if (pcVar7->format != CUBEB_SAMPLE_S16LE) {
      return (cubeb_resampler *)0x0;
    }
    pcVar8 = cubeb_resampler_create_internal<short>
                       (stream,input_params,output_params,target_rate,callback,user_ptr,quality,
                        reclock);
    return pcVar8;
  }
  pdStackY_58 = (delay_line<float> *)0x0;
  pdStackY_60 = (delay_line<float> *)0x0;
  if (((((input_params == (cubeb_stream_params *)0x0) ||
        (output_params == (cubeb_stream_params *)0x0)) || (input_params->rate != target_rate)) ||
      (output_params->rate != target_rate)) &&
     (((output_params != (cubeb_stream_params *)0x0 || input_params == (cubeb_stream_params *)0x0 ||
       (input_params->rate != target_rate)) &&
      ((output_params == (cubeb_stream_params *)0x0 || input_params != (cubeb_stream_params *)0x0 ||
       (output_params->rate != target_rate)))))) {
    pvStackY_50 = user_ptr;
    p_StackY_38 = callback;
    if (output_params == (cubeb_stream_params *)0x0) {
      this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
    }
    else {
      uVar12 = output_params->rate;
      if (uVar12 == target_rate) {
        this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else {
        this_00 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
        iVar5 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar5 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                  (this_00,output_params->channels,target_rate,uVar12,iVar5);
      }
    }
    pcStackY_40 = stream;
    if (input_params == (cubeb_stream_params *)0x0) {
      this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
    }
    else {
      uVar12 = input_params->rate;
      if (uVar12 == target_rate) {
        this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else {
        this_01 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
        iVar5 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar5 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                  (this_01,input_params->channels,uVar12,target_rate,iVar5);
      }
    }
    pvVar3 = pvStackY_50;
    if ((((this_01 == (cubeb_resampler_speex_one_way<float> *)0x0) ||
         (output_params == (cubeb_stream_params *)0x0)) ||
        (input_params == (cubeb_stream_params *)0x0)) ||
       (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0)) {
      if (((this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) &&
          (output_params != (cubeb_stream_params *)0x0)) &&
         ((input_params != (cubeb_stream_params *)0x0 &&
          (this_01 == (cubeb_resampler_speex_one_way<float> *)0x0)))) {
        pdVar10 = (delay_line<float> *)operator_new(0x48);
        iVar5 = speex_resampler_get_output_latency(this_00->speex_resampler);
        uVar6 = iVar5 + this_00->additional_latency;
        uVar12 = input_params->channels;
        uVar1 = output_params->rate;
        (pdVar10->super_processor).channels = uVar12;
        pdVar10->length = uVar6;
        pdVar10->leftover_samples = 0;
        (pdVar10->delay_output_buffer).capacity_ = 0;
        (pdVar10->delay_output_buffer).length_ = 0;
        (pdVar10->delay_input_buffer).length_ = 0;
        (pdVar10->delay_output_buffer).data_ = (float *)0x0;
        (pdVar10->delay_input_buffer).data_ = (float *)0x0;
        (pdVar10->delay_input_buffer).capacity_ = 0;
        pdVar10->sample_rate = uVar1;
        auto_array<float>::push_silence(&pdVar10->delay_input_buffer,(ulong)(uVar12 * uVar6));
        pdVar2 = pdStackY_58;
        bVar13 = pdStackY_58 != (delay_line<float> *)0x0;
        pdStackY_58 = pdVar10;
        if (bVar13) {
          std::default_delete<delay_line<float>_>::operator()
                    ((default_delete<delay_line<float>_> *)&pdStackY_58,pdVar2);
          pdVar10 = pdStackY_58;
        }
        goto joined_r0x001144d5;
      }
    }
    else {
      pdVar10 = (delay_line<float> *)operator_new(0x48);
      iVar5 = speex_resampler_get_output_latency(this_01->speex_resampler);
      uVar6 = iVar5 + this_01->additional_latency;
      uVar12 = output_params->rate;
      uVar1 = output_params->channels;
      (pdVar10->super_processor).channels = uVar1;
      pdVar10->length = uVar6;
      pdVar10->leftover_samples = 0;
      (pdVar10->delay_output_buffer).capacity_ = 0;
      (pdVar10->delay_output_buffer).length_ = 0;
      (pdVar10->delay_input_buffer).length_ = 0;
      (pdVar10->delay_output_buffer).data_ = (float *)0x0;
      (pdVar10->delay_input_buffer).data_ = (float *)0x0;
      (pdVar10->delay_input_buffer).capacity_ = 0;
      pdVar10->sample_rate = uVar12;
      auto_array<float>::push_silence(&pdVar10->delay_input_buffer,(ulong)(uVar1 * uVar6));
      pdVar2 = pdStackY_60;
      bVar13 = pdStackY_60 != (delay_line<float> *)0x0;
      pdStackY_60 = pdVar10;
      if (bVar13) {
        std::default_delete<delay_line<float>_>::operator()
                  ((default_delete<delay_line<float>_> *)&pdStackY_60,pdVar2);
        pdVar10 = pdStackY_60;
      }
joined_r0x001144d5:
      if (pdVar10 == (delay_line<float> *)0x0) {
        this = (passthrough_resampler<float> *)0x0;
        goto LAB_0011458e;
      }
    }
    bVar13 = this_00 != (cubeb_resampler_speex_one_way<float> *)0x0;
    pcStackY_48 = this_00;
    cVar4 = cubeb_log_get_level();
    this_00 = pcStackY_48;
    if (bVar13 && this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
      if ((0 < (int)cVar4) && (p_Var9 = cubeb_log_get_callback(), p_Var9 != (cubeb_log_callback)0x0)
         ) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x259,
                           "Resampling input (%d) and output (%d) to target rate of %dHz",
                           (ulong)input_params->rate,(ulong)output_params->rate,(ulong)target_rate);
      }
      this = (passthrough_resampler<float> *)operator_new(0x48);
      (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b8c8;
      *(cubeb_resampler_speex_one_way<float> **)&this->super_processor = this_01;
      this->stream = (cubeb_stream *)pcStackY_48;
      (this->internal_input_buffer).data_ = (float *)pcStackY_40;
      (this->internal_input_buffer).capacity_ = (size_t)p_StackY_38;
      (this->internal_input_buffer).length_ = (size_t)pvVar3;
      *(undefined1 *)&this->sample_rate = 0;
      this->data_callback =
           cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
           ::fill_internal_duplex;
      this->user_ptr = (void *)0x0;
      goto LAB_00114588;
    }
    if (this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
      if ((0 < (int)cVar4) && (p_Var9 = cubeb_log_get_callback(), p_Var9 != (cubeb_log_callback)0x0)
         ) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x260,
                           "Resampling input (%d) to target and output rate of %dHz",
                           (ulong)input_params->rate,(ulong)target_rate);
      }
      this = (passthrough_resampler<float> *)operator_new(0x48);
      pdVar10 = pdStackY_60;
      pdStackY_60 = (delay_line<float> *)0x0;
      (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b900;
      *(cubeb_resampler_speex_one_way<float> **)&this->super_processor = this_01;
      this->stream = (cubeb_stream *)pdVar10;
      (this->internal_input_buffer).data_ = (float *)pcStackY_40;
      (this->internal_input_buffer).capacity_ = (size_t)p_StackY_38;
      (this->internal_input_buffer).length_ = (size_t)pvVar3;
      *(undefined1 *)&this->sample_rate = 0;
      if (pdVar10 == (delay_line<float> *)0x0) {
        pcVar11 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                  ::fill_internal_input;
      }
      else {
        pcVar11 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                  ::fill_internal_duplex;
      }
      this->data_callback = pcVar11;
      this->user_ptr = (void *)0x0;
      this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
      goto LAB_0011458e;
    }
    if ((0 < (int)cVar4) && (p_Var9 = cubeb_log_get_callback(), p_Var9 != (cubeb_log_callback)0x0))
    {
      cubeb_log_internal("cubeb_resampler_internal.h",0x267,
                         "Resampling output (%dHz) to target and input rate of %dHz",
                         (ulong)output_params->rate,(ulong)target_rate);
    }
    this = (passthrough_resampler<float> *)operator_new(0x48);
    pdVar10 = pdStackY_58;
    pdStackY_58 = (delay_line<float> *)0x0;
    (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b938;
    *(delay_line<float> **)&this->super_processor = pdVar10;
    this->stream = (cubeb_stream *)this_00;
    (this->internal_input_buffer).data_ = (float *)pcStackY_40;
    (this->internal_input_buffer).capacity_ = (size_t)p_StackY_38;
    (this->internal_input_buffer).length_ = (size_t)pvVar3;
    *(undefined1 *)&this->sample_rate = 0;
    if (this_00 == (cubeb_resampler_speex_one_way<float> *)0x0 ||
        pdVar10 == (delay_line<float> *)0x0) {
      if (pdVar10 != (delay_line<float> *)0x0) {
        pcVar11 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                  ::fill_internal_input;
        goto LAB_0011475b;
      }
      if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) {
        pcVar11 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                  ::fill_internal_output;
        goto LAB_0011475b;
      }
    }
    else {
      pcVar11 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                ::fill_internal_duplex;
LAB_0011475b:
      this->data_callback = pcVar11;
      this->user_ptr = (void *)0x0;
    }
  }
  else {
    cVar4 = cubeb_log_get_level();
    if ((0 < (int)cVar4) && (p_Var9 = cubeb_log_get_callback(), p_Var9 != (cubeb_log_callback)0x0))
    {
      cubeb_log_internal("cubeb_resampler_internal.h",0x229,
                         "Input and output sample-rate match, target rate of %dHz",target_rate);
    }
    this = (passthrough_resampler<float> *)operator_new(0x48);
    if (input_params == (cubeb_stream_params *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = input_params->channels;
    }
    passthrough_resampler<float>::passthrough_resampler
              (this,stream,callback,user_ptr,uVar12,target_rate);
LAB_00114588:
    this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
  }
  this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_0011458e:
  if (pdStackY_60 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&pdStackY_60,pdStackY_60);
  }
  if (pdStackY_58 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&pdStackY_58,pdStackY_58);
  }
  if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*(code *)((cubeb *)this_00->_vptr_cubeb_resampler_speex_one_way)[1].ops)(this_00);
  }
  if (this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*this_01->_vptr_cubeb_resampler_speex_one_way[1])(this_01);
  }
  return &this->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create(cubeb_stream * stream,
                       cubeb_stream_params * input_params,
                       cubeb_stream_params * output_params,
                       unsigned int target_rate, cubeb_data_callback callback,
                       void * user_ptr, cubeb_resampler_quality quality,
                       cubeb_resampler_reclock reclock)
{
  cubeb_sample_format format;

  assert(input_params || output_params);

  if (input_params) {
    format = input_params->format;
  } else {
    format = output_params->format;
  }

  switch (format) {
  case CUBEB_SAMPLE_S16NE:
    return cubeb_resampler_create_internal<short>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  case CUBEB_SAMPLE_FLOAT32NE:
    return cubeb_resampler_create_internal<float>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  default:
    assert(false);
    return nullptr;
  }
}